

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CosineSeriesBendType.hpp
# Opt level: O2

void __thiscall
OpenMD::CosineSeriesBendType::CosineSeriesBendType
          (CosineSeriesBendType *this,RealType theta,RealType k)

{
  double dVar1;
  double dVar2;
  
  (this->super_BendType).theta0_ = theta;
  (this->super_BendType)._vptr_BendType = (_func_int **)&PTR__BendType_00287138;
  this->k_ = k;
  dVar1 = sin(theta);
  dVar2 = cos(theta);
  dVar1 = 1.0 / (dVar1 * 4.0 * dVar1);
  this->c2_ = dVar1;
  this->c0_ = ((dVar2 + dVar2) * dVar2 + 1.0) * dVar1;
  this->c1_ = dVar2 * dVar1 * -4.0;
  return;
}

Assistant:

CosineSeriesBendType(RealType theta, RealType k) : BendType(theta), k_(k) {
      RealType st = sin(theta);
      RealType ct = cos(theta);
      c2_         = 1.0 / (4.0 * st * st);
      c1_         = -4.0 * c2_ * ct;
      c0_         = c2_ * (2.0 * ct * ct + 1.0);
    }